

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O0

void __thiscall
OptionParser::parseReportOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  bool bVar1;
  int nTokens_00;
  size_type sVar2;
  reference s;
  InputError *this_00;
  bool local_1d1;
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  undefined1 local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [37];
  byte local_db;
  byte local_da;
  allocator local_d9;
  string local_d8 [36];
  IndexOption local_b4;
  int local_b0;
  int option;
  int value;
  undefined4 local_88;
  allocator local_71;
  string local_70 [32];
  Utilities local_50 [8];
  string keyword;
  string *tokens;
  int nTokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Network *network_local;
  OptionParser *this_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  nTokens_00 = (int)sVar2;
  if (1 < nTokens_00) {
    s = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](tokenList,0);
    Utilities::upperCase(local_50,s);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"PAGESIZE",&local_71);
    bVar1 = Utilities::match((string *)local_50,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if (bVar1) {
      local_88 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&value,"FILE",(allocator *)((long)&option + 3));
      bVar1 = Utilities::match((string *)local_50,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
      std::allocator<char>::~allocator((allocator<char> *)((long)&option + 3));
      if (bVar1) {
        Options::setOption(&network->options,RPT_FILE_NAME,s + 0x20);
        local_88 = 1;
      }
      else {
        local_b4 = Utilities::findFullMatch((string *)local_50,reportOptionKeywords);
        if ((int)local_b4 < 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_178,"NODES",&local_179);
          bVar1 = Utilities::match((string *)local_50,(string *)local_178);
          std::__cxx11::string::~string(local_178);
          std::allocator<char>::~allocator((allocator<char> *)&local_179);
          if (bVar1) {
            parseReportItems(this,0,network,nTokens_00,s);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1a0,"LINKS",&local_1a1);
            bVar1 = Utilities::match((string *)local_50,(string *)local_1a0);
            std::__cxx11::string::~string(local_1a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
            if (bVar1) {
              parseReportItems(this,1,network,nTokens_00,s);
            }
            else {
              parseReportField(this,network,nTokens_00,s);
            }
          }
          local_88 = 0;
        }
        else {
          local_b4 = local_b4 + REPORT_SUMMARY;
          local_da = 0;
          local_db = 0;
          local_1d1 = false;
          if (local_b4 == REPORT_STATUS) {
            std::allocator<char>::allocator();
            local_da = 1;
            std::__cxx11::string::string(local_d8,"FULL",&local_d9);
            local_db = 1;
            local_1d1 = Utilities::match(s + 0x20,(string *)local_d8);
          }
          if ((local_db & 1) != 0) {
            std::__cxx11::string::~string(local_d8);
          }
          if ((local_da & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_d9);
          }
          if (local_1d1 == false) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_100,"YES",&local_101);
            bVar1 = Utilities::match(s + 0x20,(string *)local_100);
            std::__cxx11::string::~string(local_100);
            std::allocator<char>::~allocator((allocator<char> *)&local_101);
            if (bVar1) {
              local_b0 = 1;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_128,"NO",&local_129);
              bVar1 = Utilities::match(s + 0x20,(string *)local_128);
              std::__cxx11::string::~string(local_128);
              std::allocator<char>::~allocator((allocator<char> *)&local_129);
              if (!bVar1) {
                local_151 = 1;
                this_00 = (InputError *)__cxa_allocate_exception(0x30);
                std::__cxx11::string::string(local_150,(string *)(s + 0x20));
                InputError::InputError(this_00,3,(string *)local_150);
                local_151 = 0;
                __cxa_throw(this_00,&InputError::typeinfo,InputError::~InputError);
              }
              local_b0 = 0;
            }
            Options::setOption(&network->options,local_b4,local_b0);
            local_88 = 1;
          }
          else {
            Options::setOption(&network->options,REPORT_TRIALS,1);
            Options::setOption(&network->options,REPORT_STATUS,1);
            local_88 = 1;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void OptionParser::parseReportOption(Network* network, vector<string>& tokenList)
{
    // ... check for no data
    int nTokens = tokenList.size();
    if ( nTokens < 2 ) return;
    string* tokens = &tokenList[0];
    string keyword = Utilities::upperCase(tokens[0]);

    // ... PAGESIZE is deprecated
    if ( Utilities::match(keyword, "PAGESIZE") ) return;

    // ... check if option is name of report file
    if ( Utilities::match(keyword, "FILE") )
    {
        network->options.setOption(Options::RPT_FILE_NAME, tokens[1]);
        return;
    }

    // ... check for report types options
    int value;
    int option = Utilities::findFullMatch(keyword, reportOptionKeywords);
    if ( option >= 0 )
    {
        option = Options::REPORT_SUMMARY + option;

        // ... convert EPANET 2 "STATUS FULL" option to "TRIALS  YES" option
        if ( option == Options::REPORT_STATUS && Utilities::match(tokens[1], "FULL") )
        {
            network->options.setOption(Options::REPORT_TRIALS, true);
            network->options.setOption(Options::REPORT_STATUS, true);
            return;
        }

        if ( Utilities::match(tokens[1], "YES") ) value = true;
        else if ( Utilities::match(tokens[1], "NO") ) value = false;
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
        network->options.setOption((Options::IndexOption)option, value);
        return;
    }

    // ... parse which nodes & links are reported on
    if ( Utilities::match(keyword, "NODES") )
    {
        parseReportItems(Element::NODE, network, nTokens, tokens);
    }
    else if ( Utilities::match(keyword, "LINKS") )
    {
        parseReportItems(Element::LINK, network, nTokens, tokens);
    }

    // ... parse report field options
    else parseReportField(network, nTokens, tokens);
}